

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::FileDescriptorProto::MergePartialFromCodedStream
          (FileDescriptorProto *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte bVar1;
  byte *pbVar2;
  char *data;
  bool bVar3;
  uint32 uVar4;
  UnknownFieldSet *unknown_fields;
  string *psVar5;
  EnumDescriptorProto *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_00;
  Type *pTVar6;
  DescriptorProto *value_01;
  FileOptions *value_02;
  ServiceDescriptorProto *value_03;
  FieldDescriptorProto *value_04;
  SourceCodeInfo *value_05;
  RepeatedField<int> *pRVar7;
  char cVar8;
  uint tag;
  ulong uVar9;
  
  this_00 = &this->dependency_;
LAB_002f72e7:
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_002f730a;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_002f730a:
      uVar4 = io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar9 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar4 | uVar9;
    }
    tag = (uint)uVar9;
    if ((uVar9 & 0x100000000) == 0) goto switchD_002f7374_default;
    cVar8 = (char)uVar9;
    switch((uint)(uVar9 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar8 == '\n') {
        psVar5 = mutable_name_abi_cxx11_(this);
        bVar3 = internal::WireFormatLite::ReadBytes(input,psVar5);
        if (!bVar3) {
          return false;
        }
        psVar5 = (this->name_).ptr_;
        internal::WireFormatLite::VerifyUtf8String
                  ((psVar5->_M_dataplus)._M_p,(int)psVar5->_M_string_length,PARSE,
                   "google.protobuf.FileDescriptorProto.name");
        goto LAB_002f72e7;
      }
      break;
    case 2:
      if (cVar8 == '\x12') {
        psVar5 = mutable_package_abi_cxx11_(this);
        bVar3 = internal::WireFormatLite::ReadBytes(input,psVar5);
        if (!bVar3) {
          return false;
        }
        psVar5 = (this->package_).ptr_;
        internal::WireFormatLite::VerifyUtf8String
                  ((psVar5->_M_dataplus)._M_p,(int)psVar5->_M_string_length,PARSE,
                   "google.protobuf.FileDescriptorProto.package");
        goto LAB_002f72e7;
      }
      break;
    case 3:
      if (cVar8 == '\x1a') {
        value_00 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::Add(this_00);
        bVar3 = internal::WireFormatLite::ReadBytes(input,value_00);
        if (!bVar3) {
          return false;
        }
        pTVar6 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,
                            (this->dependency_).super_RepeatedPtrFieldBase.current_size_ + -1);
        data = (pTVar6->_M_dataplus)._M_p;
        pTVar6 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,
                            (this->dependency_).super_RepeatedPtrFieldBase.current_size_ + -1);
        internal::WireFormatLite::VerifyUtf8String
                  (data,(int)pTVar6->_M_string_length,PARSE,
                   "google.protobuf.FileDescriptorProto.dependency");
        goto LAB_002f72e7;
      }
      break;
    case 4:
      if (cVar8 != '\"') break;
      value_01 = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(&this->message_type_);
      bVar3 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::DescriptorProto>
                        (input,value_01);
      goto LAB_002f7358;
    case 5:
      if (cVar8 == '*') {
        value = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Add(&this->enum_type_);
        bVar3 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::EnumDescriptorProto>(input,value);
        goto LAB_002f7358;
      }
      break;
    case 6:
      if (cVar8 == '2') {
        value_03 = RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::Add(&this->service_);
        bVar3 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::ServiceDescriptorProto>(input,value_03);
        goto LAB_002f7358;
      }
      break;
    case 7:
      if (cVar8 == ':') {
        value_04 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(&this->extension_);
        bVar3 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::FieldDescriptorProto>(input,value_04);
        goto LAB_002f7358;
      }
      break;
    case 8:
      if (cVar8 == 'B') {
        value_02 = mutable_options(this);
        bVar3 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::FileOptions>
                          (input,value_02);
        goto LAB_002f7358;
      }
      break;
    case 9:
      if (cVar8 == 'J') {
        value_05 = mutable_source_code_info(this);
        bVar3 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::SourceCodeInfo>
                          (input,value_05);
        goto LAB_002f7358;
      }
      break;
    case 10:
      pRVar7 = &this->public_dependency_;
      if (cVar8 == 'R') {
LAB_002f75d9:
        bVar3 = internal::WireFormatLite::
                ReadPackedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,pRVar7);
        goto LAB_002f7358;
      }
      if ((tag & 0xff) == 0x50) {
        uVar4 = 0x50;
LAB_002f759b:
        bVar3 = internal::WireFormatLite::
                ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (1,uVar4,input,pRVar7);
        goto LAB_002f7358;
      }
      break;
    case 0xb:
      pRVar7 = &this->weak_dependency_;
      if (cVar8 == 'Z') goto LAB_002f75d9;
      if ((tag & 0xff) == 0x58) {
        uVar4 = 0x58;
        goto LAB_002f759b;
      }
      break;
    case 0xc:
      if (cVar8 == 'b') {
        psVar5 = mutable_syntax_abi_cxx11_(this);
        bVar3 = internal::WireFormatLite::ReadBytes(input,psVar5);
        if (!bVar3) {
          return false;
        }
        psVar5 = (this->syntax_).ptr_;
        internal::WireFormatLite::VerifyUtf8String
                  ((psVar5->_M_dataplus)._M_p,(int)psVar5->_M_string_length,PARSE,
                   "google.protobuf.FileDescriptorProto.syntax");
        goto LAB_002f72e7;
      }
    }
switchD_002f7374_default:
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    unknown_fields = mutable_unknown_fields(this);
    bVar3 = internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_002f7358:
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool FileDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.FileDescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileDescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string package = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->package().data(), this->package().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileDescriptorProto.package");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string dependency = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_dependency()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->dependency(this->dependency_size() - 1).data(),
            this->dependency(this->dependency_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileDescriptorProto.dependency");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.DescriptorProto message_type = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_message_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_enum_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.ServiceDescriptorProto service = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_service()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto extension = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FileOptions options = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(74u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_source_code_info()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 public_dependency = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 80u, input, this->mutable_public_dependency())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(82u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_public_dependency())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 weak_dependency = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 88u, input, this->mutable_weak_dependency())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(90u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_weak_dependency())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string syntax = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(98u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_syntax()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->syntax().data(), this->syntax().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileDescriptorProto.syntax");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.FileDescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.FileDescriptorProto)
  return false;
#undef DO_
}